

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout_p.h
# Opt level: O1

void __thiscall
QToolBarAreaLayoutItem::resize(QToolBarAreaLayoutItem *this,Orientation o,int newSize)

{
  QSize QVar1;
  QSize QVar2;
  QSize QVar3;
  Representation RVar4;
  
  QVar2 = minimumSize(this);
  QVar3 = sizeHint(this);
  QVar1 = (QSize)((ulong)QVar2 >> 0x20);
  if (o == Horizontal) {
    QVar1 = QVar2;
  }
  QVar2 = (QSize)((ulong)QVar3 >> 0x20);
  if (o == Horizontal) {
    QVar2 = QVar3;
  }
  RVar4.m_i = QVar1.wd.m_i.m_i;
  if (QVar1.wd.m_i.m_i <= newSize) {
    RVar4.m_i = newSize;
  }
  if (RVar4.m_i == QVar2.wd.m_i.m_i) {
    this->preferredSize = -1;
    this->size = QVar2.wd.m_i.m_i;
  }
  else {
    this->preferredSize = RVar4.m_i;
  }
  return;
}

Assistant:

void resize(Qt::Orientation o, int newSize)
    {
        newSize = qMax(pick(o, minimumSize()), newSize);
        int sizeh = pick(o, sizeHint());
        if (newSize == sizeh) {
            preferredSize = -1;
            size = sizeh;
        } else {
            preferredSize = newSize;
        }
    }